

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMemoryAllocation.h
# Opt level: O0

bool okResize<double>(vector<double,_std::allocator<double>_> *use_vector,HighsInt dimension,
                     double value)

{
  value_type_conflict1 *in_RDI;
  bad_alloc *e;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)e,
             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
  return true;
}

Assistant:

bool okResize(std::vector<T>& use_vector, HighsInt dimension, T value = T{}) {
  try {
    use_vector.resize(dimension, value);
  } catch (const std::bad_alloc& e) {
    printf("HighsMemoryAllocation::okResize fails with %s\n", e.what());
    return false;
  }
  return true;
}